

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t *seqStore,ZSTD_CCtx *zc)

{
  symbolEncodingType_e sVar1;
  seqDef *psVar2;
  BYTE *codeTable;
  BYTE *codeTable_00;
  BYTE *codeTable_01;
  seqDef *psVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  uint *count;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar11;
  size_t local_48;
  
  sVar5 = ZSTD_buildBlockEntropyStats
                    (seqStore,&((zc->blockState).prevCBlock)->entropy,
                     &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                     &(zc->blockSplitCtx).entropyMetadata,zc->entropyWorkspace,0x22d8);
  if (sVar5 < 0xffffffffffffff89) {
    psVar2 = seqStore->sequences;
    local_48 = (long)seqStore->lit - (long)seqStore->litStart;
    codeTable = seqStore->ofCode;
    codeTable_00 = seqStore->llCode;
    codeTable_01 = seqStore->mlCode;
    psVar3 = seqStore->sequencesStart;
    pZVar4 = (zc->blockState).nextCBlock;
    count = zc->entropyWorkspace;
    sVar1 = (zc->blockSplitCtx).entropyMetadata.hufMetadata.hType;
    uVar11 = 0xff;
    if (sVar1 - set_compressed < 2) {
      sVar5 = HIST_count_wksp(count,(uint *)&stack0xffffffffffffffac,seqStore->litStart,local_48,
                              count,0x22d8);
      if (sVar5 < 0xffffffffffffff89) {
        if ((int)uVar11 < 0) {
          uVar10 = 0;
        }
        else {
          lVar9 = 0;
          uVar10 = 0;
          do {
            uVar10 = uVar10 + (ulong)count[lVar9] *
                              (ulong)(byte)(pZVar4->entropy).huf.CTable[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while ((ulong)uVar11 + 1 != lVar9);
          uVar10 = uVar10 >> 3;
        }
        if (sVar1 == set_compressed) {
          uVar10 = uVar10 + (zc->blockSplitCtx).entropyMetadata.hufMetadata.hufDesSize;
        }
        uVar8 = uVar10 + 6;
        if (local_48 < 0x100) {
          uVar8 = uVar10;
        }
        local_48 = ((ulong)(0x3ff < local_48) - (ulong)(local_48 < 0x4000)) + 4 + uVar8;
      }
    }
    else if (sVar1 != set_basic) {
      if (sVar1 != set_rle) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5f24,
                      "size_t ZSTD_estimateBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                     );
      }
      local_48 = 1;
    }
    uVar10 = (long)psVar2 - (long)psVar3 >> 3;
    sVar5 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.ofType,codeTable,uVar10,0x1f,
                       (pZVar4->entropy).fse.offcodeCTable,(U8 *)0x0,OF_defaultNorm,5,0x1c,count,
                       CONCAT44(uVar11,in_stack_ffffffffffffffa8));
    sVar6 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.llType,codeTable_00,uVar10,
                       0x23,(pZVar4->entropy).fse.litlengthCTable,"",LL_defaultNorm,6,0x23,count,
                       CONCAT44(uVar11,in_stack_ffffffffffffffa8));
    sVar7 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.mlType,codeTable_01,uVar10,
                       0x34,(pZVar4->entropy).fse.matchlengthCTable,"",ML_defaultNorm,6,0x34,count,
                       CONCAT44(uVar11,in_stack_ffffffffffffffa8));
    sVar5 = (zc->blockSplitCtx).entropyMetadata.fseMetadata.fseTablesSize +
            ((ulong)(0x7f < uVar10) - (ulong)(uVar10 < 0x7f00)) + sVar5 + sVar6 + sVar7 + local_48 +
            6;
  }
  return sVar5;
}

Assistant:

static size_t
ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t* seqStore, ZSTD_CCtx* zc)
{
    ZSTD_entropyCTablesMetadata_t* const entropyMetadata = &zc->blockSplitCtx.entropyMetadata;
    DEBUGLOG(6, "ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize()");
    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(seqStore,
                    &zc->blockState.prevCBlock->entropy,
                    &zc->blockState.nextCBlock->entropy,
                    &zc->appliedParams,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE), "");
    return ZSTD_estimateBlockSize(
                    seqStore->litStart, (size_t)(seqStore->lit - seqStore->litStart),
                    seqStore->ofCode, seqStore->llCode, seqStore->mlCode,
                    (size_t)(seqStore->sequences - seqStore->sequencesStart),
                    &zc->blockState.nextCBlock->entropy,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE,
                    (int)(entropyMetadata->hufMetadata.hType == set_compressed), 1);
}